

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O1

void __thiscall
CGameContext::CreateDamage
          (CGameContext *this,vec2 Pos,int Id,vec2 Source,int HealthAmount,int ArmorAmount,bool Self
          )

{
  undefined8 *puVar1;
  float fVar2;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_38;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_34;
  
  fVar2 = atan2f(Source.field_1.y,Source.field_0.x);
  puVar1 = (undefined8 *)CEventHandler::Create(&this->m_Events,0x16,0x1c,-1);
  if (puVar1 != (undefined8 *)0x0) {
    local_38 = Pos.field_0;
    aStack_34 = Pos.field_1;
    *puVar1 = CONCAT44((int)aStack_34.y,(int)local_38.x);
    *(int *)(puVar1 + 1) = Id;
    *(int *)((long)puVar1 + 0xc) = (int)(fVar2 * 256.0);
    *(int *)(puVar1 + 2) = HealthAmount;
    *(int *)((long)puVar1 + 0x14) = ArmorAmount;
    *(uint *)(puVar1 + 3) = (uint)Self;
  }
  return;
}

Assistant:

void CGameContext::CreateDamage(vec2 Pos, int Id, vec2 Source, int HealthAmount, int ArmorAmount, bool Self)
{
	float f = angle(Source);
	CNetEvent_Damage *pEvent = (CNetEvent_Damage *)m_Events.Create(NETEVENTTYPE_DAMAGE, sizeof(CNetEvent_Damage));
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_ClientID = Id;
		pEvent->m_Angle = (int)(f*256.0f);
		pEvent->m_HealthAmount = HealthAmount;
		pEvent->m_ArmorAmount = ArmorAmount;
		pEvent->m_Self = Self;
	}
}